

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

ZSTD_DCtx * ZSTD_createDCtx_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_allocFunction in_stack_00000008;
  ZSTD_DCtx *dctx;
  
  if ((in_stack_00000008 == (ZSTD_allocFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    customMem_00.customFree = (ZSTD_freeFunction)customMem.customAlloc;
    customMem_00.customAlloc = in_stack_00000008;
    customMem_00.opaque = customMem.customFree;
    dctx = (ZSTD_DCtx *)ZSTD_customMalloc(0x276d8,customMem_00);
    if (dctx == (ZSTD_DCtx *)0x0) {
      dctx = (ZSTD_DCtx *)0x0;
    }
    else {
      (dctx->customMem).customAlloc = in_stack_00000008;
      (dctx->customMem).customFree = (ZSTD_freeFunction)customMem.customAlloc;
      *(undefined1 (*) [16])&(dctx->customMem).opaque = customMem._8_16_;
      ZSTD_initDCtx_internal(dctx);
    }
  }
  else {
    dctx = (ZSTD_DCtx *)0x0;
  }
  return dctx;
}

Assistant:

ZSTD_DCtx* ZSTD_createDCtx_advanced(ZSTD_customMem customMem)
{
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;

    {   ZSTD_DCtx* const dctx = (ZSTD_DCtx*)ZSTD_customMalloc(sizeof(*dctx), customMem);
        if (!dctx) return NULL;
        dctx->customMem = customMem;
        ZSTD_initDCtx_internal(dctx);
        return dctx;
    }
}